

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.cpp
# Opt level: O3

string * __thiscall
I18N::FormatV(string *__return_storage_ptr__,I18N *this,string *id,
             vector<util::variant,_std::allocator<util::variant>_> *v)

{
  pointer pcVar1;
  pointer pvVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  int iVar5;
  iterator iVar6;
  long *plVar7;
  size_type *psVar8;
  size_type sVar9;
  pointer pvVar10;
  string format;
  string number_buffer;
  variant x;
  string local_b8;
  string local_98;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  var_type local_40;
  
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this->lang_config)._M_t.
                    super___uniq_ptr_impl<Config,_std::default_delete<Config>_>._M_t.
                    super__Tuple_impl<0UL,_Config_*,_std::default_delete<Config>_>.
                    super__Head_base<0UL,_Config_*,_false>._M_head_impl,id);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar1 = (id->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + id->_M_string_length);
    pvVar10 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pvVar2 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar10 != pvVar2) {
      do {
        local_78._0_4_ = pvVar10->val_int;
        local_78._4_4_ = *(undefined4 *)&pvVar10->field_0x4;
        local_78._8_4_ = *(undefined4 *)&pvVar10->val_float;
        local_78._12_4_ = *(undefined4 *)((long)&pvVar10->val_float + 4);
        pcVar1 = (pvVar10->val_string)._M_dataplus._M_p;
        local_68._M_allocated_capacity = (size_type)&local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_78 + 0x10),pcVar1,
                   pcVar1 + (pvVar10->val_string)._M_string_length);
        local_40 = pvVar10->type;
        local_48._0_1_ = pvVar10->val_bool;
        local_48._1_1_ = pvVar10->cache_val[0];
        local_48._2_1_ = pvVar10->cache_val[1];
        local_48._3_1_ = pvVar10->cache_val[2];
        local_48._4_1_ = pvVar10->cache_val[3];
        local_48._5_3_ = *(undefined3 *)&pvVar10->field_0x35;
        util::variant::GetString_abi_cxx11_(&local_98,(variant *)local_78);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a2506);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8.field_2._8_8_ = plVar7[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1)
          ;
        }
        pvVar10 = pvVar10 + 1;
      } while (pvVar10 != pvVar2);
    }
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    util::variant::GetString_abi_cxx11_
              (&local_b8,
               (variant *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      ._M_cur + 0x28));
    _Var4._M_p = local_b8._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    if (local_b8._M_string_length != 0) {
      sVar9 = 0;
      bVar3 = false;
      do {
        if (bVar3) {
          if (_Var4._M_p[sVar9] == '}') {
            util::variant::variant((variant *)local_78,&local_98);
            iVar5 = util::variant::GetInt((variant *)local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_allocated_capacity != &local_58) {
              operator_delete((void *)local_68._M_allocated_capacity,
                              local_58._M_allocated_capacity + 1);
            }
            pvVar10 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            if ((ulong)(long)(iVar5 + -1) <
                (ulong)((long)(v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 6)) {
              util::variant::GetString_abi_cxx11_((string *)local_78,pvVar10 + (iVar5 + -1));
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,CONCAT44(local_78._4_4_,local_78._0_4_));
              if ((undefined1 *)CONCAT44(local_78._4_4_,local_78._0_4_) != local_78 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_78._4_4_,local_78._0_4_),
                                (ulong)(local_68._M_allocated_capacity + 1));
              }
            }
            else {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            bVar3 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_98,0,(char *)local_98._M_string_length,0x1a38e9);
          }
          else {
            bVar3 = true;
            std::__cxx11::string::push_back((char)&local_98);
          }
        }
        else {
          bVar3 = true;
          if (_Var4._M_p[sVar9] != '{') {
            bVar3 = false;
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
        }
        sVar9 = sVar9 + 1;
      } while (local_b8._M_string_length != sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string I18N::FormatV(const std::string& id, std::vector<util::variant> &&v) const
{
	auto it = lang_config->find(id);

	if (it == lang_config->end())
	{
		std::string result = id;

		UTIL_FOREACH(v, x)
		{
			result += " " + std::string(x);
		}

		return result;
	}

	std::string result;
	std::string format = std::string(it->second);
	std::string number_buffer;
	int state = 0;

	UTIL_FOREACH(format, c)
	{
		if (state == 0)
		{
			if (c == '{')
			{
				state = 1;
			}
			else
			{
				result += c;
			}
		}
		else if (state == 1)
		{
			if (c == '}')
			{
				std::size_t index = int(util::variant(number_buffer)) - 1;

				if (index >= v.size())
					result += "#ERROR#";
				else
					result += std::string(v[index]);

				number_buffer = "";
				state = 0;
			}
			else
			{
				number_buffer += c;
			}
		}
	}

	return result;
}